

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void gauden_accum_param(vector_t ***out,vector_t ***in,uint32 n_mgau,uint32 n_feat,uint32 n_density,
                       uint32 *veclen)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  for (uVar2 = 0; uVar2 != n_mgau; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar3 != n_feat; uVar3 = uVar3 + 1) {
      for (uVar4 = 0; uVar4 != n_density; uVar4 = uVar4 + 1) {
        uVar1 = veclen[uVar3];
        for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
          out[uVar2][uVar3][uVar4][uVar5] =
               in[uVar2][uVar3][uVar4][uVar5] + out[uVar2][uVar3][uVar4][uVar5];
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_accum_param(vector_t ***out,
		   vector_t ***in,
		   uint32 n_mgau,
		   uint32 n_feat,
		   uint32 n_density,
		   const uint32 *veclen)
{
    uint32 i, j, k, l;

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    out[i][j][k][l] += in[i][j][k][l];
		}
	    }
	}
    }
}